

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void YUV420ToRGB_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,__m128i *R,__m128i *G,__m128i *B)

{
  uint8_t *in_RDI;
  __m128i V0;
  __m128i U0;
  __m128i Y0;
  __m128i *in_stack_00000068;
  __m128i *in_stack_00000070;
  __m128i *in_stack_00000078;
  uint8_t *in_stack_ffffffffffffffc8;
  
  Load_HI_16_SSE2(in_RDI);
  Load_UV_HI_8_SSE2(in_stack_ffffffffffffffc8);
  Load_UV_HI_8_SSE2(in_stack_ffffffffffffffc8);
  ConvertYUV444ToRGB_SSE2
            (in_stack_00000078,in_stack_00000070,in_stack_00000068,(__m128i *)y,(__m128i *)u,
             (__m128i *)v);
  return;
}

Assistant:

static void YUV420ToRGB_SSE2(const uint8_t* WEBP_RESTRICT const y,
                             const uint8_t* WEBP_RESTRICT const u,
                             const uint8_t* WEBP_RESTRICT const v,
                             __m128i* const R, __m128i* const G,
                             __m128i* const B) {
  const __m128i Y0 = Load_HI_16_SSE2(y), U0 = Load_UV_HI_8_SSE2(u),
                V0 = Load_UV_HI_8_SSE2(v);
  ConvertYUV444ToRGB_SSE2(&Y0, &U0, &V0, R, G, B);
}